

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

LY_ERR lyxml_ctx_next(lyxml_ctx *xmlctx)

{
  anon_union_8_2_192256a2_for_lyxml_ctx_3 *prefix;
  anon_union_8_2_4da628e2_for_lyxml_ctx_5 *prefix_len;
  anon_union_8_2_8c61af87_for_lyxml_ctx_7 *name;
  anon_union_8_2_93990481_for_lyxml_ctx_9 *name_len;
  char cVar1;
  uint32_t uVar2;
  lyd_node *plVar3;
  char *prefix_00;
  size_t prefix_len_00;
  char *name_00;
  size_t name_len_00;
  LYXML_PARSER_STATUS LVar4;
  LY_ERR LVar5;
  LY_ERR LVar6;
  ly_bool closing;
  ly_bool local_39;
  anon_union_8_2_93990481_for_lyxml_ctx_9 *local_38;
  
  LVar4 = xmlctx->status;
  if (((LVar4 == LYXML_ATTR_CONTENT) || (LVar4 == LYXML_ELEM_CONTENT)) &&
     ((xmlctx->field_6).dynamic != '\0')) {
    free((xmlctx->field_3).prefix);
    (xmlctx->field_3).prefix = (char *)0x0;
    (xmlctx->field_6).dynamic = '\0';
    LVar4 = xmlctx->status;
  }
  switch(LVar4) {
  case LYXML_ELEMENT:
  case LYXML_ATTR_CONTENT:
    prefix = &xmlctx->field_3;
    prefix_len = &xmlctx->field_4;
    name = &xmlctx->field_5;
    name_len = &xmlctx->field_6;
    LVar5 = lyxml_next_attribute
                      (xmlctx,&prefix->prefix,&prefix_len->prefix_len,&name->name,
                       &name_len->name_len);
    if (LVar5 == LY_SUCCESS) {
      cVar1 = *xmlctx->in->current;
      LVar5 = LY_SUCCESS;
      LVar6 = LY_SUCCESS;
      if (cVar1 == '/') {
        prefix->prefix = "";
        prefix_len->prefix_len = 0;
        name->ws_only = '\x01';
        name_len->dynamic = '\0';
        LVar4 = LYXML_ELEM_CONTENT;
        goto LAB_001a13ed;
      }
      LVar4 = LYXML_ATTRIBUTE;
      LVar6 = LVar5;
      if (cVar1 != '>') goto LAB_001a13ed;
      local_38 = name_len;
      ly_in_skip(xmlctx->in,1);
      if (*xmlctx->in->current == '\0') {
        ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
        LVar5 = LY_EVALID;
      }
      else {
        LVar5 = lyxml_parse_value(xmlctx,'<',&prefix->prefix,&prefix_len->prefix_len,&name->ws_only,
                                  &local_38->dynamic);
        if (LVar5 == LY_SUCCESS) {
          LVar4 = LYXML_ELEM_CONTENT;
          if (prefix_len->prefix_len == 0) {
            if (local_38->dynamic != '\0') {
              free(prefix->prefix);
            }
            prefix->prefix = "";
            local_38->dynamic = '\0';
          }
          goto LAB_001a13ed;
        }
      }
    }
    break;
  case LYXML_ELEM_CLOSE:
switchD_001a126d_caseD_1:
    LVar5 = lyxml_next_element(xmlctx,&(xmlctx->field_3).prefix,&(xmlctx->field_4).prefix_len,
                               &(xmlctx->field_5).name,&(xmlctx->field_6).name_len,&local_39);
    if (LVar5 == LY_SUCCESS) {
      if (*xmlctx->in->current == '\0') {
        LVar5 = LY_SUCCESS;
      }
      else {
        prefix_00 = (xmlctx->field_3).prefix;
        prefix_len_00 = (xmlctx->field_4).prefix_len;
        name_00 = (xmlctx->field_5).name;
        name_len_00 = (xmlctx->field_6).name_len;
        if (local_39 == '\0') {
          LVar5 = lyxml_open_element(xmlctx,prefix_00,prefix_len_00,name_00,name_len_00);
          if (LVar5 == LY_SUCCESS) {
            LVar4 = LYXML_ELEMENT;
            goto LAB_001a147e;
          }
        }
        else {
          LVar6 = LY_SUCCESS;
          LVar5 = lyxml_close_element(xmlctx,prefix_00,prefix_len_00,name_00,name_len_00,'\0');
          if (LVar5 == LY_SUCCESS) {
            LVar4 = LYXML_ELEM_CLOSE;
            goto LAB_001a13ed;
          }
        }
      }
    }
    break;
  case LYXML_ELEM_CONTENT:
    if (*xmlctx->in->current != '/') goto switchD_001a126d_caseD_1;
    uVar2 = (xmlctx->elements).count;
    if (uVar2 == 0) {
      __assert_fail("xmlctx->elements.count",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xml.c",
                    0x3cf,"LY_ERR lyxml_ctx_next(struct lyxml_ctx *)");
    }
    plVar3 = (xmlctx->elements).field_2.dnodes[uVar2 - 1];
    LVar4 = LYXML_ELEM_CLOSE;
    LVar5 = lyxml_close_element(xmlctx,*(char **)plVar3,(size_t)plVar3->parent,
                                (char *)plVar3->schema,(size_t)plVar3->next,'\x01');
    if (LVar5 != LY_SUCCESS) break;
LAB_001a147e:
    LVar6 = LY_SUCCESS;
    goto LAB_001a13ed;
  case LYXML_ATTRIBUTE:
    LVar5 = lyxml_next_attr_content
                      (xmlctx,&(xmlctx->field_3).prefix,&(xmlctx->field_4).prefix_len,
                       &(xmlctx->field_5).ws_only,&(xmlctx->field_6).dynamic);
    if (LVar5 == LY_SUCCESS) {
      LVar6 = LY_SUCCESS;
      LVar4 = LYXML_ATTR_CONTENT;
      goto LAB_001a13ed;
    }
    break;
  default:
    return LY_SUCCESS;
  }
  LVar6 = LVar5;
  LVar4 = LYXML_END;
LAB_001a13ed:
  xmlctx->status = LVar4;
  return LVar6;
}

Assistant:

LY_ERR
lyxml_ctx_next(struct lyxml_ctx *xmlctx)
{
    LY_ERR ret = LY_SUCCESS;
    ly_bool closing;
    struct lyxml_elem *e;

    /* if the value was not used, free it */
    if (((xmlctx->status == LYXML_ELEM_CONTENT) || (xmlctx->status == LYXML_ATTR_CONTENT)) && xmlctx->dynamic) {
        free((char *)xmlctx->value);
        xmlctx->value = NULL;
        xmlctx->dynamic = 0;
    }

    switch (xmlctx->status) {
    case LYXML_ELEM_CONTENT:
        /* content |</elem> */

        /* handle special case when empty content for "<elem/>" was returned */
        if (xmlctx->in->current[0] == '/') {
            assert(xmlctx->elements.count);
            e = (struct lyxml_elem *)xmlctx->elements.objs[xmlctx->elements.count - 1];

            /* close the element (parses closing tag) */
            ret = lyxml_close_element(xmlctx, e->prefix, e->prefix_len, e->name, e->name_len, 1);
            LY_CHECK_GOTO(ret, cleanup);

            /* update status */
            xmlctx->status = LYXML_ELEM_CLOSE;
            break;
        }
    /* fall through */
    case LYXML_ELEM_CLOSE:
        /* </elem>| <elem2>* */

        /* parse next element, if any */
        ret = lyxml_next_element(xmlctx, &xmlctx->prefix, &xmlctx->prefix_len, &xmlctx->name, &xmlctx->name_len, &closing);
        LY_CHECK_GOTO(ret, cleanup);

        if (xmlctx->in->current[0] == '\0') {
            /* update status */
            xmlctx->status = LYXML_END;
        } else if (closing) {
            /* close an element (parses also closing tag) */
            ret = lyxml_close_element(xmlctx, xmlctx->prefix, xmlctx->prefix_len, xmlctx->name, xmlctx->name_len, 0);
            LY_CHECK_GOTO(ret, cleanup);

            /* update status */
            xmlctx->status = LYXML_ELEM_CLOSE;
        } else {
            /* open an element, also parses all enclosed namespaces */
            ret = lyxml_open_element(xmlctx, xmlctx->prefix, xmlctx->prefix_len, xmlctx->name, xmlctx->name_len);
            LY_CHECK_GOTO(ret, cleanup);

            /* update status */
            xmlctx->status = LYXML_ELEMENT;
        }
        break;

    case LYXML_ELEMENT:
    /* <elem| attr='val'* > content  */
    case LYXML_ATTR_CONTENT:
        /* attr='val'| attr='val'* > content */

        /* parse attribute name, if any */
        ret = lyxml_next_attribute(xmlctx, &xmlctx->prefix, &xmlctx->prefix_len, &xmlctx->name, &xmlctx->name_len);
        LY_CHECK_GOTO(ret, cleanup);

        if (xmlctx->in->current[0] == '>') {
            /* no attributes but a closing tag */
            ly_in_skip(xmlctx->in, 1);
            if (!xmlctx->in->current[0]) {
                LOGVAL(xmlctx->ctx, LY_VCODE_EOF);
                ret = LY_EVALID;
                goto cleanup;
            }

            /* parse element content */
            ret = lyxml_parse_value(xmlctx, '<', (char **)&xmlctx->value, &xmlctx->value_len, &xmlctx->ws_only,
                    &xmlctx->dynamic);
            LY_CHECK_GOTO(ret, cleanup);

            if (!xmlctx->value_len) {
                /* empty value should by alocated staticaly, but check for in any case */
                if (xmlctx->dynamic) {
                    free((char *) xmlctx->value);
                }
                /* use empty value, easier to work with */
                xmlctx->value = "";
                xmlctx->dynamic = 0;
            }

            /* update status */
            xmlctx->status = LYXML_ELEM_CONTENT;
        } else if (xmlctx->in->current[0] == '/') {
            /* no content but we still return it */
            xmlctx->value = "";
            xmlctx->value_len = 0;
            xmlctx->ws_only = 1;
            xmlctx->dynamic = 0;

            /* update status */
            xmlctx->status = LYXML_ELEM_CONTENT;
        } else {
            /* update status */
            xmlctx->status = LYXML_ATTRIBUTE;
        }
        break;

    case LYXML_ATTRIBUTE:
        /* attr|='val' */

        /* skip formatting and parse value */
        ret = lyxml_next_attr_content(xmlctx, &xmlctx->value, &xmlctx->value_len, &xmlctx->ws_only, &xmlctx->dynamic);
        LY_CHECK_GOTO(ret, cleanup);

        /* update status */
        xmlctx->status = LYXML_ATTR_CONTENT;
        break;

    case LYXML_END:
        /* </elem>   |EOF */
        /* nothing to do */
        break;
    }

cleanup:
    if (ret) {
        /* invalidate context */
        xmlctx->status = LYXML_END;
    }
    return ret;
}